

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetNextTreeNodeOpen(bool is_open,ImGuiCond cond)

{
  ImGuiContext *pIVar1;
  ImGuiCond local_1c;
  ImGuiContext *g;
  ImGuiCond cond_local;
  bool is_open_local;
  
  pIVar1 = GImGui;
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    GImGui->NextTreeNodeOpenVal = is_open;
    local_1c = cond;
    if (cond == 0) {
      local_1c = 1;
    }
    pIVar1->NextTreeNodeOpenCond = local_1c;
  }
  return;
}

Assistant:

void ImGui::SetNextTreeNodeOpen(bool is_open, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    if (g.CurrentWindow->SkipItems)
        return;
    g.NextTreeNodeOpenVal = is_open;
    g.NextTreeNodeOpenCond = cond ? cond : ImGuiCond_Always;
}